

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O2

QDataStream *
QtPrivate::readArrayBasedContainer<QList<QKeyCombination>>(QDataStream *s,QList<QKeyCombination> *c)

{
  qint64 asize;
  long in_FS_OFFSET;
  bool bVar1;
  QKeyCombination local_3c;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  StreamStateSaver::StreamStateSaver((StreamStateSaver *)local_38,s);
  QList<QKeyCombination>::clear(c);
  asize = QDataStream::readQSizeType(s);
  if (asize < 0) {
    QDataStream::setStatus((Status)s);
  }
  else {
    QList<QKeyCombination>::reserve(c,asize);
    while (bVar1 = asize != 0, asize = asize + -1, bVar1) {
      local_3c.combination = 0x1ffffff;
      ::operator>>(s,&local_3c);
      if (s[0x13] != (QDataStream)0x0) {
        QList<QKeyCombination>::clear(c);
        break;
      }
      QList<QKeyCombination>::emplaceBack<QKeyCombination_const&>(c,&local_3c);
    }
  }
  StreamStateSaver::~StreamStateSaver((StreamStateSaver *)local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}